

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

void vocerr(voccxdef *ctx,int err,char *f,...)

{
  char in_AL;
  undefined8 in_RCX;
  int err_00;
  undefined8 in_R8;
  __va_list_tag *argptr_00;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argptr;
  vocerr_va_info info;
  undefined1 local_2a8 [16];
  undefined1 *local_298;
  undefined1 local_288 [24];
  char local_270 [8];
  char local_268 [8];
  char local_260 [8];
  char local_258 [16];
  char local_248 [16];
  char local_238 [16];
  char local_228 [16];
  char local_218 [16];
  char local_208 [16];
  char local_1f8 [16];
  char local_1e8 [24];
  
  argptr_00 = (__va_list_tag *)local_2a8;
  if (in_AL != '\0') {
    local_258._0_8_ = in_XMM0_Qa;
    local_248._0_8_ = in_XMM1_Qa;
    local_238._0_8_ = in_XMM2_Qa;
    local_228._0_8_ = in_XMM3_Qa;
    local_218._0_8_ = in_XMM4_Qa;
    local_208._0_8_ = in_XMM5_Qa;
    local_1f8._0_8_ = in_XMM6_Qa;
    local_1e8._0_8_ = in_XMM7_Qa;
  }
  if (ctx->voccxunknown < 1) {
    local_2a8._0_4_ = 0x18;
    local_2a8._4_4_ = 0x30;
    local_2a8._8_8_ = &argptr[0].overflow_arg_area;
    local_298 = local_288;
    local_270 = (char  [8])in_RCX;
    local_268 = (char  [8])in_R8;
    local_260 = (char  [8])in_R9;
    vocerr_va_prep(ctx,(vocerr_va_info *)&stack0xfffffffffffffe30,err,f,(__va_list_tag *)local_2a8);
    local_2a8._0_4_ = 0x18;
    local_2a8._4_4_ = 0x30;
    local_2a8._8_8_ = &argptr[0].overflow_arg_area;
    local_298 = local_288;
    vocerr_va((voccxdef *)&stack0xfffffffffffffe30,(vocerr_va_info *)local_2a8,err_00,f,argptr_00);
  }
  return;
}

Assistant:

void vocerr(voccxdef *ctx, int err, char *f, ...)
{
    va_list argptr;
    struct vocerr_va_info info;

    /*
     *   If the unknown word flag is set, suppress this error, because
     *   we're going to be trying the whole parsing from the beginning
     *   again anyway.  
     */
    if (ctx->voccxunknown > 0)
        return;

    /* prepare to format the message */
    va_start(argptr, f);
    vocerr_va_prep(ctx, &info, err, f, argptr);
    va_end(argptr);

    /* call the general vocerr formatter */
    va_start(argptr, f);
    vocerr_va(ctx, &info, err, f, argptr);
    va_end(argptr);
}